

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix.hpp
# Opt level: O1

double ising::square::transfer_matrix::free_energy
                 (double beta,int Lx,int Ly,vector<double,_std::allocator<double>_> *inter,
                 vector<double,_std::allocator<double>_> *field)

{
  pointer pdVar1;
  ulong uVar2;
  uint uVar3;
  size_type __n;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  exp_double weight;
  vector<double,_std::allocator<double>_> v;
  vector<double,_std::allocator<double>_> field_x;
  vector<double,_std::allocator<double>_> inter_y;
  vector<double,_std::allocator<double>_> inter_x;
  exp_double sum;
  exp_number<double> local_118;
  uint local_104;
  exp_number<double> local_100;
  double local_f0;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  double local_88;
  ulong local_70;
  size_t local_68;
  ulong local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  long local_48;
  exp_number<double> local_40;
  
  __n = (size_type)Lx;
  local_104 = Ly;
  local_f0 = beta;
  local_50 = inter;
  std::vector<double,_std::allocator<double>_>::vector(&local_a0,__n,(allocator_type *)&local_b8);
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__n,(allocator_type *)&local_d0);
  if ((field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish ==
      (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    __n = 0;
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_d0,__n,(allocator_type *)&local_e8);
  uVar3 = 1 << ((byte)Lx & 0x1f);
  local_58 = field;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_e8,(long)(int)uVar3,(allocator_type *)&local_100);
  local_40.sign_ = 0;
  local_40.log_ = 0.0;
  __x = extraout_XMM0_Qa;
  if (Lx != 0x1f) {
    local_70 = 1;
    if (1 < (int)uVar3) {
      local_70 = (ulong)uVar3;
    }
    local_68 = local_70 * 8;
    uVar7 = (ulong)(uint)Lx;
    local_88 = (double)(ulong)local_104;
    local_48 = uVar7 << 4;
    uVar8 = 0;
    do {
      pdVar1 = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_118.sign_ = 1;
      local_118.log_ = 0.0;
      memset(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,0,local_68);
      pdVar1[uVar8] = 1.0;
      local_60 = uVar8;
      if (0 < (int)local_104) {
        lVar5 = 8;
        lVar4 = 0;
        uVar8 = 0;
        do {
          if (0 < Lx) {
            pdVar1 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar6 = 0;
            do {
              *(undefined8 *)
               ((long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6) =
                   *(undefined8 *)((long)pdVar1 + lVar6 * 2 + lVar5 + -8);
              *(undefined8 *)
               ((long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6) =
                   *(undefined8 *)((long)pdVar1 + lVar6 * 2 + lVar5);
              lVar6 = lVar6 + 8;
            } while (uVar7 * 8 - lVar6 != 0);
          }
          if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start && 0 < Lx) {
            pdVar1 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar2 = 0;
            do {
              local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar2] =
                   *(double *)((long)pdVar1 + uVar2 * 8 + lVar4);
              uVar2 = uVar2 + 1;
            } while (uVar7 != uVar2);
          }
          product_D<std::vector<double,std::allocator<double>>>
                    ((transfer_matrix *)&local_100,local_f0,&local_a0,&local_d0,&local_e8);
          local_118.log_ = local_118.log_ + local_100.log_;
          local_118.sign_ = local_118.sign_ * local_100.sign_;
          if (ABS(local_118.log_ / local_100.log_) < 1e-10) {
            local_118.log_ = 0.0;
          }
          product_U<std::vector<double,std::allocator<double>>>
                    ((transfer_matrix *)&local_100,local_f0,&local_b8,&local_e8);
          local_118.log_ = local_118.log_ + local_100.log_;
          local_118.sign_ = local_118.sign_ * local_100.sign_;
          if (ABS(local_118.log_ / local_100.log_) < 1e-10) {
            local_118.log_ = 0.0;
          }
          uVar8 = uVar8 + 1;
          lVar5 = lVar5 + local_48;
          lVar4 = lVar4 + uVar7 * 8;
        } while ((double)uVar8 != local_88);
      }
      uVar8 = local_60;
      standards::exp_number<double>::exp_number
                (&local_100,
                 local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[local_60]);
      local_118.log_ = local_118.log_ + local_100.log_;
      local_118.sign_ = local_118.sign_ * local_100.sign_;
      if (ABS(local_118.log_ / local_100.log_) < 1e-10) {
        local_118.log_ = 0.0;
      }
      standards::exp_number<double>::operator+=(&local_40,&local_118);
      uVar8 = uVar8 + 1;
      __x = extraout_XMM0_Qa_00;
    } while (uVar8 != local_70);
  }
  local_88 = standards::exp_number<double>::log(&local_40,__x);
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return -local_88 / local_f0;
}

Assistant:

static double free_energy(double beta, int Lx, int Ly,
                            std::vector<double> const& inter,
                            std::vector<double> const& field = std::vector<double>(0)) {
    std::vector<double> inter_x(Lx), inter_y(Lx), field_x(field.size() > 0 ? Lx : 0);
    int dim = 1 << Lx;
    std::vector<double> v(dim);
    exp_double sum = 0;
    for (int i = 0; i < dim; ++i) {
      exp_double weight = 1;
      for (int j = 0; j < dim; ++j) v[j] = 0;
      v[i] = 1;
      for (int y = 0; y < Ly; ++y) {
        for (int x = 0; x < Lx; ++x) {
          inter_x[x] = inter[2 * (Lx * y + x)];
          inter_y[x] = inter[2 * (Lx * y + x) + 1];
        }
        if (field_x.size()) {
          for (int x = 0; x < Lx; ++x) {
            field_x[x] = field[Lx * y + x];
          }
        }
        weight *= ising::square::transfer_matrix::product_D(beta, inter_x, field_x, v);
        weight *= ising::square::transfer_matrix::product_U(beta, inter_y, v);
      }
      weight *= v[i];
      sum += weight;
    }
    return -log(sum) / beta;
  }